

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<char> s;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  size_t __n_00;
  string_view sv;
  basic_string_view<char> *in_stack_ffffffffffffffc0;
  format_specs *in_stack_ffffffffffffffc8;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_ffffffffffffffe0;
  char *local_18;
  
  __n_00 = CONCAT71((int7)(__n >> 8),(char)__fd) & 0xffffffffffffff01;
  basic_string_view<char>::basic_string_view(in_stack_ffffffffffffffc0,(char *)this);
  if (this->specs_ == (format_specs *)0x0) {
    sVar1 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
                      (&this->writer_,(int)in_stack_ffffffffffffffe0,local_18,__n_00);
  }
  else {
    s.size_ = (size_t)in_stack_ffffffffffffffe0;
    s.data_ = local_18;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write<char>
              (in_stack_ffffffffffffffe0,s,in_stack_ffffffffffffffc8);
    sVar1 = extraout_RAX;
  }
  return sVar1;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }